

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O0

bool __thiscall version_struct::operator>=(version_struct *this,version_struct *v)

{
  version_struct *v_local;
  version_struct *this_local;
  bool local_1;
  
  if (this->major < v->major) {
    local_1 = false;
  }
  else if (v->major < this->major) {
    local_1 = true;
  }
  else if (this->minor < v->minor) {
    local_1 = false;
  }
  else if (v->minor < this->minor) {
    local_1 = true;
  }
  else if (this->rev < v->rev) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool operator>=(version_struct v)
  {
    if (major < v.major)
      return false;
    if (major > v.major)
      return true;
    if (minor < v.minor)
      return false;
    if (minor > v.minor)
      return true;
    if (rev >= v.rev)
      return true;
    return false;
  }